

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_specialpaths.cpp
# Opt level: O0

FString GetUserFile(char *file)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  char *in_RSI;
  FString local_170;
  FString oldpath;
  bool moved;
  FString configPath;
  stat extrainfo;
  FString local_b8;
  undefined1 local_b0 [8];
  stat info;
  char *file_local;
  FString *path;
  
  info.__glibc_reserved[2]._7_1_ = 0;
  FString::FString((FString *)file);
  NicePath((char *)&local_b8);
  FString::operator=((FString *)file,&local_b8);
  FString::~FString(&local_b8);
  pcVar2 = FString::operator_cast_to_char_((FString *)file);
  iVar1 = stat(pcVar2,(stat *)local_b0);
  if (iVar1 == -1) {
    NicePath(&stack0xfffffffffffffea0);
    pcVar2 = FString::operator_cast_to_char_((FString *)&stack0xfffffffffffffea0);
    iVar1 = stat(pcVar2,(stat *)&configPath);
    if (iVar1 == -1) {
      pcVar2 = FString::operator_cast_to_char_((FString *)&stack0xfffffffffffffea0);
      iVar1 = mkdir(pcVar2,0x1c0);
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        I_FatalError("Failed to create ~/.config directory:\n%s",pcVar2);
      }
    }
    else if (((uint)extrainfo.st_nlink & 0xf000) != 0x4000) {
      I_FatalError("~/.config must be a directory");
    }
    oldpath.Chars._7_1_ = 0;
    NicePath((char *)&local_170);
    pcVar2 = FString::operator_cast_to_char_(&local_170);
    iVar1 = stat(pcVar2,(stat *)&configPath);
    if (iVar1 != -1) {
      pcVar2 = FString::operator_cast_to_char_(&local_170);
      pcVar4 = FString::operator_cast_to_char_((FString *)file);
      iVar1 = rename(pcVar2,pcVar4);
      if (iVar1 == -1) {
        pcVar2 = FString::GetChars(&local_170);
        pcVar4 = FString::GetChars((FString *)file);
        I_Error("Failed to move old zdoom directory (%s) to new location (%s).",pcVar2,pcVar4);
      }
      else {
        oldpath.Chars._7_1_ = 1;
      }
    }
    if ((oldpath.Chars._7_1_ & 1) == 0) {
      pcVar2 = FString::operator_cast_to_char_((FString *)file);
      iVar1 = mkdir(pcVar2,0x1c0);
      if (iVar1 == -1) {
        pcVar2 = FString::GetChars((FString *)file);
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        I_FatalError("Failed to create %s directory:\n%s",pcVar2,pcVar4);
      }
    }
    FString::~FString(&local_170);
    FString::~FString((FString *)&stack0xfffffffffffffea0);
  }
  else if (((uint)info.st_nlink & 0xf000) != 0x4000) {
    pcVar2 = FString::GetChars((FString *)file);
    I_FatalError("%s must be a directory",pcVar2);
  }
  FString::operator+=((FString *)file,in_RSI);
  return (FString)file;
}

Assistant:

FString GetUserFile (const char *file)
{
	FString path;
	struct stat info;

	path = NicePath("~/" GAME_DIR "/");

	if (stat (path, &info) == -1)
	{
		struct stat extrainfo;

		// Sanity check for ~/.config
		FString configPath = NicePath("~/.config/");
		if (stat (configPath, &extrainfo) == -1)
		{
			if (mkdir (configPath, S_IRUSR | S_IWUSR | S_IXUSR) == -1)
			{
				I_FatalError ("Failed to create ~/.config directory:\n%s", strerror(errno));
			}
		}
		else if (!S_ISDIR(extrainfo.st_mode))
		{
			I_FatalError ("~/.config must be a directory");
		}

		// This can be removed after a release or two
		// Transfer the old zdoom directory to the new location
		bool moved = false;
		FString oldpath = NicePath("~/." GAMENAMELOWERCASE "/");
		if (stat (oldpath, &extrainfo) != -1)
		{
			if (rename(oldpath, path) == -1)
			{
				I_Error ("Failed to move old " GAMENAMELOWERCASE " directory (%s) to new location (%s).",
					oldpath.GetChars(), path.GetChars());
			}
			else
				moved = true;
		}

		if (!moved && mkdir (path, S_IRUSR | S_IWUSR | S_IXUSR) == -1)
		{
			I_FatalError ("Failed to create %s directory:\n%s",
				path.GetChars(), strerror (errno));
		}
	}
	else
	{
		if (!S_ISDIR(info.st_mode))
		{
			I_FatalError ("%s must be a directory", path.GetChars());
		}
	}
	path += file;
	return path;
}